

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O1

void __thiscall
cuckoocache_tests::EraseTest::test_cache_erase<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (EraseTest *this,size_t megabytes)

{
  uchar *puVar1;
  pointer puVar2;
  uchar *puVar3;
  ushort uVar4;
  uint256 e;
  uint256 e_00;
  undefined8 uVar5;
  uint64_t uVar6;
  pointer puVar7;
  ulong uVar8;
  readonly_property<bool> rVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  iterator pvVar14;
  iterator in_R8;
  iterator in_R9;
  iterator pvVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  double hit_rate_fresh;
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  vector<uint256,_std::allocator<uint256>_> hashes;
  cache<uint256,_SignatureCacheHasher> set;
  check_type cVar46;
  char *pcVar45;
  double local_248;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined8 local_200;
  undefined1 local_1f8 [16];
  undefined1 *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  double local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  vector<uint256,_std::allocator<uint256>_> local_180;
  undefined1 local_168 [16];
  pointer local_158;
  undefined8 *local_150;
  assertion_result local_148;
  undefined8 **local_130;
  double *local_128;
  char *local_120;
  char *local_118;
  assertion_result local_110;
  cache<uint256,_SignatureCacheHasher> local_f8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  check_type cStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  lazy_ostream local_58;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BasicTestingSetup,ZEROS);
  local_168 = (undefined1  [16])0x0;
  local_158 = (pointer)0x0;
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&local_f8);
  uVar22 = megabytes << 0xf;
  uVar13 = uVar22 & 0x7ffffffffff8000;
  if (0xfffffffe < uVar13) {
    uVar13 = 0xffffffff;
  }
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup(&local_f8,(uint32_t)uVar13);
  std::vector<uint256,_std::allocator<uint256>_>::resize
            ((vector<uint256,_std::allocator<uint256>_> *)local_168,uVar22 & 0xffffffff);
  if ((int)uVar22 != 0) {
    uVar20 = uVar22 & 0xffffffff;
    lVar18 = 0;
    uVar13 = 0;
    do {
      uVar5 = local_168._0_8_;
      lVar10 = 0;
      do {
        uVar6 = RandomMixin<FastRandomContext>::randbits<32>
                          (&(this->super_BasicTestingSetup).m_rng.
                            super_RandomMixin<FastRandomContext>);
        *(int *)((((base_blob<256U> *)uVar5)->m_data)._M_elems + lVar10 * 4 + lVar18) = (int)uVar6;
        lVar10 = lVar10 + 1;
      } while ((char)lVar10 != '\b');
      uVar13 = uVar13 + 1;
      lVar18 = lVar18 + 0x20;
    } while (uVar13 != uVar20);
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector
            (&local_180,(vector<uint256,_std::allocator<uint256>_> *)local_168);
  uVar17 = (uint)uVar22;
  uVar21 = (uint)(uVar22 >> 1) & 0x7fffffff;
  uVar11 = (uint)megabytes;
  uVar13 = uVar22;
  if (uVar17 != 0) {
    lVar18 = 0;
    do {
      puVar1 = ((local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + lVar18;
      local_78 = *(undefined8 *)puVar1;
      _cVar46 = *(check_type *)(puVar1 + 8);
      puVar3 = ((local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar18 + 0x10;
      local_68 = *(undefined8 *)puVar3;
      uStack_60 = *(undefined8 *)(puVar3 + 8);
      e.super_base_blob<256U>.m_data._M_elems[0x10] = (char)local_68;
      e.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)local_68 >> 8);
      e.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)local_68 >> 0x10);
      e.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)local_68 >> 0x18);
      e.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)local_68 >> 0x20);
      e.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)local_68 >> 0x28);
      e.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)local_68 >> 0x30);
      e.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)local_68 >> 0x38);
      e.super_base_blob<256U>.m_data._M_elems._0_16_ = *(undefined1 (*) [16])puVar1;
      e.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uStack_60;
      e.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)uStack_60 >> 8);
      e.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)uStack_60 >> 0x10);
      e.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)uStack_60 >> 0x18);
      e.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)uStack_60 >> 0x20);
      e.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)uStack_60 >> 0x28);
      e.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)uStack_60 >> 0x30);
      e.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)uStack_60 >> 0x38);
      _cStack_70 = _cVar46;
      CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(&local_f8,e);
      lVar18 = lVar18 + 0x20;
    } while ((ulong)(uVar21 + ((uVar22 >> 1 & 0x7fffffff) == 0)) << 5 != lVar18);
  }
  uVar22 = uVar22 >> 2;
  uVar19 = (uint)uVar22 & 0x3fffffff;
  local_248 = 0.0;
  dVar34 = 0.0;
  dVar33 = 0.0;
  if (uVar17 != 0) {
    uVar20 = 0;
    do {
      local_190 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
      ;
      local_188 = "";
      local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_198 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x9b;
      file.m_begin = (iterator)&local_190;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a0,msg)
      ;
      uVar16 = (ulong)local_f8.size;
      uVar8 = *(uint *)(((pointer)(local_168._0_8_ + uVar20 * 0x20))->super_base_blob<256U>).m_data.
                       _M_elems * uVar16 >> 0x20;
      local_58._8_4_ =
           SUB84(*(uint *)((((pointer)(local_168._0_8_ + uVar20 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 8) * uVar16 >> 0x20,0);
      local_58._12_4_ =
           (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar20 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 0xc) * uVar16 >> 0x20);
      local_48 = (undefined1 *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar20 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x14) * uVar16 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar20 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x10) * uVar16 >>
                               0x20));
      local_40 = (lazy_ostream *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar20 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar16 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar20 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x18) * uVar16 >>
                               0x20));
      puVar7 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start + uVar8;
      auVar25 = *(undefined1 (*) [16])
                 (local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8].super_base_blob<256U>.m_data._M_elems +
                 0x10);
      puVar2 = (pointer)(local_168._0_8_ + uVar20 * 0x20);
      auVar37[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[0]);
      auVar37[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[1]);
      auVar37[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[2]);
      auVar37[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[3]);
      auVar37[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[4]);
      auVar37[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[5]);
      auVar37[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[6]);
      auVar37[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[7]);
      auVar37[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[8]);
      auVar37[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[9]);
      auVar37[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar7->super_base_blob<256U>).m_data._M_elems[10]);
      auVar37[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar37[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar37[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar37[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar37[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar1 = (((pointer)(local_168._0_8_ + uVar20 * 0x20))->super_base_blob<256U>).m_data._M_elems
               + 0x10;
      auVar23[0] = -(*puVar1 == auVar25[0]);
      auVar23[1] = -(puVar1[1] == auVar25[1]);
      auVar23[2] = -(puVar1[2] == auVar25[2]);
      auVar23[3] = -(puVar1[3] == auVar25[3]);
      auVar23[4] = -(puVar1[4] == auVar25[4]);
      auVar23[5] = -(puVar1[5] == auVar25[5]);
      auVar23[6] = -(puVar1[6] == auVar25[6]);
      auVar23[7] = -(puVar1[7] == auVar25[7]);
      auVar23[8] = -(puVar1[8] == auVar25[8]);
      auVar23[9] = -(puVar1[9] == auVar25[9]);
      auVar23[10] = -(puVar1[10] == auVar25[10]);
      auVar23[0xb] = -(puVar1[0xb] == auVar25[0xb]);
      auVar23[0xc] = -(puVar1[0xc] == auVar25[0xc]);
      auVar23[0xd] = -(puVar1[0xd] == auVar25[0xd]);
      auVar23[0xe] = -(puVar1[0xe] == auVar25[0xe]);
      auVar23[0xf] = -(puVar1[0xf] == auVar25[0xf]);
      auVar23 = auVar23 & auVar37;
      if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff) {
        rVar9.super_class_property<bool>.value = (class_property<bool>)true;
      }
      else {
        puVar7 = (pointer)(local_168._0_8_ + uVar20 * 0x20);
        lVar18 = 4;
        do {
          rVar9.super_class_property<bool>.value = (class_property<bool>)(lVar18 != 0x20);
          if (lVar18 == 0x20) goto LAB_00375994;
          uVar8 = (ulong)*(uint *)((long)&local_58._vptr_lazy_ostream + lVar18);
          puVar2 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar8;
          auVar25 = *(undefined1 (*) [16])
                     (local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8].super_base_blob<256U>.m_data._M_elems
                     + 0x10);
          auVar38[0] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
          auVar38[1] = -((puVar7->super_base_blob<256U>).m_data._M_elems[1] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
          auVar38[2] = -((puVar7->super_base_blob<256U>).m_data._M_elems[2] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
          auVar38[3] = -((puVar7->super_base_blob<256U>).m_data._M_elems[3] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
          auVar38[4] = -((puVar7->super_base_blob<256U>).m_data._M_elems[4] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
          auVar38[5] = -((puVar7->super_base_blob<256U>).m_data._M_elems[5] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
          auVar38[6] = -((puVar7->super_base_blob<256U>).m_data._M_elems[6] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
          auVar38[7] = -((puVar7->super_base_blob<256U>).m_data._M_elems[7] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
          auVar38[8] = -((puVar7->super_base_blob<256U>).m_data._M_elems[8] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
          auVar38[9] = -((puVar7->super_base_blob<256U>).m_data._M_elems[9] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
          auVar38[10] = -((puVar7->super_base_blob<256U>).m_data._M_elems[10] ==
                         (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
          auVar38[0xb] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xb] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar38[0xc] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xc] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar38[0xd] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xd] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar38[0xe] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xe] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar38[0xf] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xf] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar24[0] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x10] == auVar25[0]);
          auVar24[1] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x11] == auVar25[1]);
          auVar24[2] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x12] == auVar25[2]);
          auVar24[3] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x13] == auVar25[3]);
          auVar24[4] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x14] == auVar25[4]);
          auVar24[5] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x15] == auVar25[5]);
          auVar24[6] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x16] == auVar25[6]);
          auVar24[7] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x17] == auVar25[7]);
          auVar24[8] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x18] == auVar25[8]);
          auVar24[9] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x19] == auVar25[9]);
          auVar24[10] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1a] == auVar25[10]);
          auVar24[0xb] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1b] == auVar25[0xb]);
          auVar24[0xc] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1c] == auVar25[0xc]);
          auVar24[0xd] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1d] == auVar25[0xd]);
          auVar24[0xe] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1e] == auVar25[0xe]);
          auVar24[0xf] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1f] == auVar25[0xf]);
          auVar24 = auVar24 & auVar38;
          lVar18 = lVar18 + 4;
        } while ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff);
      }
      LOCK();
      (((atomic<unsigned_char> *)
       ((long)local_f8.collection_flags.mem._M_t.
              super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
              .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl +
       (uVar8 >> 3)))->super___atomic_base<unsigned_char>)._M_i =
           (((atomic<unsigned_char> *)
            ((long)local_f8.collection_flags.mem._M_t.
                   super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                   .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl +
            (uVar8 >> 3)))->super___atomic_base<unsigned_char>)._M_i |
           (byte)(1 << ((byte)uVar8 & 7));
      UNLOCK();
LAB_00375994:
      local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)rVar9.super_class_property<bool>.value;
      local_148.m_message.px = (element_type *)0x0;
      local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1f8._0_8_ = "set.contains(hashes[i], true)";
      local_1f8._8_8_ = "";
      local_58._8_4_ = local_58._8_4_ & 0xffffff00;
      local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
      local_48 = boost::unit_test::lazy_ostream::inst;
      local_40 = (lazy_ostream *)local_1f8;
      local_1b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
      ;
      local_1a8 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_148,&local_58,1,0,WARN,_cVar46,(size_t)&local_1b0,0x9b);
      boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar19 + ((uVar22 & 0x3fffffff) == 0));
    uVar11 = (uint)megabytes;
    uVar20 = (ulong)((uVar11 & 0x1ffff) << 0xe);
    uVar17 = (uint)uVar13;
    lVar18 = (ulong)(uVar11 & 0x1ffff) << 0x13;
    do {
      puVar1 = ((local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + lVar18;
      local_98 = *(undefined8 *)puVar1;
      uStack_90 = *(undefined8 *)(puVar1 + 8);
      puVar3 = ((local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar18 + 0x10;
      local_88 = *(undefined8 *)puVar3;
      uStack_80 = *(undefined8 *)(puVar3 + 8);
      e_00.super_base_blob<256U>.m_data._M_elems[0x10] = (char)local_88;
      e_00.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)local_88 >> 8);
      e_00.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)local_88 >> 0x10);
      e_00.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)local_88 >> 0x18);
      e_00.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)local_88 >> 0x20);
      e_00.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)local_88 >> 0x28);
      e_00.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)local_88 >> 0x30);
      e_00.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)local_88 >> 0x38);
      e_00.super_base_blob<256U>.m_data._M_elems._0_16_ = *(undefined1 (*) [16])puVar1;
      e_00.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uStack_80;
      e_00.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)uStack_80 >> 8);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)uStack_80 >> 0x10);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)uStack_80 >> 0x18);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)uStack_80 >> 0x20);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)uStack_80 >> 0x28);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)uStack_80 >> 0x30);
      e_00.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)uStack_80 >> 0x38);
      CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(&local_f8,e_00);
      uVar20 = uVar20 + 1;
      lVar18 = lVar18 + 0x20;
    } while (uVar20 < (uVar17 & 0xffff8000));
    uVar20 = (ulong)local_f8.size;
    uVar8 = 0;
    in_R8 = (iterator)0x0;
    uVar17 = (uint)uVar13;
    do {
      uVar13 = *(uint *)(((pointer)(local_168._0_8_ + uVar8 * 0x20))->super_base_blob<256U>).m_data.
                        _M_elems * uVar20;
      uVar16 = uVar13 >> 0x20;
      local_58._vptr_lazy_ostream =
           (_func_int **)
           CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar8 * 0x20))->
                                    super_base_blob<256U>).m_data._M_elems + 4) * uVar20 >> 0x20),
                    (int)(uVar13 >> 0x20));
      local_58._8_4_ =
           (uint)(*(uint *)((((pointer)(local_168._0_8_ + uVar8 * 0x20))->super_base_blob<256U>).
                            m_data._M_elems + 8) * uVar20 >> 0x20);
      local_58._12_4_ =
           (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar8 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 0xc) * uVar20 >> 0x20);
      local_48 = (undefined1 *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x14) * uVar20 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x10) * uVar20 >>
                               0x20));
      local_40 = (lazy_ostream *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar20 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar8 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x18) * uVar20 >>
                               0x20));
      puVar7 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start + uVar16;
      puVar1 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16].super_base_blob<256U>.m_data._M_elems + 0x10
      ;
      puVar2 = (pointer)(local_168._0_8_ + uVar8 * 0x20);
      auVar39[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[0]);
      auVar39[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[1]);
      auVar39[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[2]);
      auVar39[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[3]);
      auVar39[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[4]);
      auVar39[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[5]);
      auVar39[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[6]);
      auVar39[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[7]);
      auVar39[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[8]);
      auVar39[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[9]);
      auVar39[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar7->super_base_blob<256U>).m_data._M_elems[10]);
      auVar39[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar39[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar39[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar39[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar39[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar3 = (((pointer)(local_168._0_8_ + uVar8 * 0x20))->super_base_blob<256U>).m_data._M_elems
               + 0x10;
      auVar25[0] = -(*puVar3 == *puVar1);
      auVar25[1] = -(puVar3[1] == puVar1[1]);
      auVar25[2] = -(puVar3[2] == puVar1[2]);
      auVar25[3] = -(puVar3[3] == puVar1[3]);
      auVar25[4] = -(puVar3[4] == puVar1[4]);
      auVar25[5] = -(puVar3[5] == puVar1[5]);
      auVar25[6] = -(puVar3[6] == puVar1[6]);
      auVar25[7] = -(puVar3[7] == puVar1[7]);
      auVar25[8] = -(puVar3[8] == puVar1[8]);
      auVar25[9] = -(puVar3[9] == puVar1[9]);
      auVar25[10] = -(puVar3[10] == puVar1[10]);
      auVar25[0xb] = -(puVar3[0xb] == puVar1[0xb]);
      auVar25[0xc] = -(puVar3[0xc] == puVar1[0xc]);
      auVar25[0xd] = -(puVar3[0xd] == puVar1[0xd]);
      auVar25[0xe] = -(puVar3[0xe] == puVar1[0xe]);
      auVar25[0xf] = -(puVar3[0xf] == puVar1[0xf]);
      auVar25 = auVar25 & auVar39;
      if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
        in_R9 = (iterator)0x1;
      }
      else {
        puVar7 = (pointer)(local_168._0_8_ + uVar8 * 0x20);
        lVar18 = 4;
        do {
          lVar10 = lVar18;
          if (lVar10 == 0x20) break;
          uVar12 = *(uint *)((long)&local_58._vptr_lazy_ostream + lVar10);
          puVar2 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar12;
          puVar1 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12].super_base_blob<256U>.m_data._M_elems +
                   0x10;
          auVar40[0] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
          auVar40[1] = -((puVar7->super_base_blob<256U>).m_data._M_elems[1] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
          auVar40[2] = -((puVar7->super_base_blob<256U>).m_data._M_elems[2] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
          auVar40[3] = -((puVar7->super_base_blob<256U>).m_data._M_elems[3] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
          auVar40[4] = -((puVar7->super_base_blob<256U>).m_data._M_elems[4] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
          auVar40[5] = -((puVar7->super_base_blob<256U>).m_data._M_elems[5] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
          auVar40[6] = -((puVar7->super_base_blob<256U>).m_data._M_elems[6] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
          auVar40[7] = -((puVar7->super_base_blob<256U>).m_data._M_elems[7] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
          auVar40[8] = -((puVar7->super_base_blob<256U>).m_data._M_elems[8] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
          auVar40[9] = -((puVar7->super_base_blob<256U>).m_data._M_elems[9] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
          auVar40[10] = -((puVar7->super_base_blob<256U>).m_data._M_elems[10] ==
                         (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
          auVar40[0xb] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xb] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar40[0xc] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xc] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar40[0xd] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xd] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar40[0xe] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xe] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar40[0xf] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xf] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar26[0] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x10] == *puVar1);
          auVar26[1] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x11] == puVar1[1]);
          auVar26[2] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x12] == puVar1[2]);
          auVar26[3] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x13] == puVar1[3]);
          auVar26[4] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x14] == puVar1[4]);
          auVar26[5] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x15] == puVar1[5]);
          auVar26[6] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x16] == puVar1[6]);
          auVar26[7] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x17] == puVar1[7]);
          auVar26[8] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x18] == puVar1[8]);
          auVar26[9] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x19] == puVar1[9]);
          auVar26[10] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1a] == puVar1[10]);
          auVar26[0xb] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1b] == puVar1[0xb]);
          auVar26[0xc] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1c] == puVar1[0xc]);
          auVar26[0xd] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1d] == puVar1[0xd]);
          auVar26[0xe] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1e] == puVar1[0xe]);
          auVar26[0xf] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1f] == puVar1[0xf]);
          auVar26 = auVar26 & auVar40;
          lVar18 = lVar10 + 4;
        } while ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff);
        in_R9 = (iterator)(ulong)(lVar10 != 0x20);
      }
      in_R8 = in_R8 + (long)in_R9;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar19 + ((uVar22 & 0x3fffffff) == 0));
    auVar27._8_4_ = (int)((ulong)in_R8 >> 0x20);
    auVar27._0_8_ = in_R8;
    auVar27._12_4_ = 0x45300000;
    dVar33 = auVar27._8_8_ - 1.9342813113834067e+25;
    dVar34 = dVar33 + ((double)CONCAT44(0x43300000,(int)in_R8) - 4503599627370496.0);
  }
  if (uVar19 < uVar21) {
    uVar22 = (ulong)local_f8.size;
    uVar12 = (uVar11 & 0x1ffff) * 0x2000;
    uVar13 = (ulong)uVar12;
    pvVar14 = (iterator)0x0;
    do {
      uVar20 = *(uint *)(((pointer)(local_168._0_8_ + uVar13 * 0x20))->super_base_blob<256U>).m_data
                        ._M_elems * uVar22;
      uVar8 = uVar20 >> 0x20;
      local_58._vptr_lazy_ostream =
           (_func_int **)
           CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->
                                    super_base_blob<256U>).m_data._M_elems + 4) * uVar22 >> 0x20),
                    (int)(uVar20 >> 0x20));
      local_58._8_4_ =
           (uint)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->super_base_blob<256U>).
                            m_data._M_elems + 8) * uVar22 >> 0x20);
      local_58._12_4_ =
           (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 0xc) * uVar22 >> 0x20);
      local_48 = (undefined1 *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x14) * uVar22 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x10) * uVar22 >>
                               0x20));
      local_40 = (lazy_ostream *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar22 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x18) * uVar22 >>
                               0x20));
      puVar7 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start + uVar8;
      puVar1 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8].super_base_blob<256U>.m_data._M_elems + 0x10;
      puVar2 = (pointer)(local_168._0_8_ + uVar13 * 0x20);
      auVar41[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[0]);
      auVar41[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[1]);
      auVar41[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[2]);
      auVar41[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[3]);
      auVar41[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[4]);
      auVar41[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[5]);
      auVar41[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[6]);
      auVar41[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[7]);
      auVar41[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[8]);
      auVar41[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[9]);
      auVar41[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar7->super_base_blob<256U>).m_data._M_elems[10]);
      auVar41[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar41[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar41[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar41[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar41[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar3 = (((pointer)(local_168._0_8_ + uVar13 * 0x20))->super_base_blob<256U>).m_data._M_elems
               + 0x10;
      auVar28[0] = -(*puVar3 == *puVar1);
      auVar28[1] = -(puVar3[1] == puVar1[1]);
      auVar28[2] = -(puVar3[2] == puVar1[2]);
      auVar28[3] = -(puVar3[3] == puVar1[3]);
      auVar28[4] = -(puVar3[4] == puVar1[4]);
      auVar28[5] = -(puVar3[5] == puVar1[5]);
      auVar28[6] = -(puVar3[6] == puVar1[6]);
      auVar28[7] = -(puVar3[7] == puVar1[7]);
      auVar28[8] = -(puVar3[8] == puVar1[8]);
      auVar28[9] = -(puVar3[9] == puVar1[9]);
      auVar28[10] = -(puVar3[10] == puVar1[10]);
      auVar28[0xb] = -(puVar3[0xb] == puVar1[0xb]);
      auVar28[0xc] = -(puVar3[0xc] == puVar1[0xc]);
      auVar28[0xd] = -(puVar3[0xd] == puVar1[0xd]);
      auVar28[0xe] = -(puVar3[0xe] == puVar1[0xe]);
      auVar28[0xf] = -(puVar3[0xf] == puVar1[0xf]);
      auVar28 = auVar28 & auVar41;
      uVar4 = (ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar28[0xf] >> 7) << 0xf;
      in_R9 = (iterator)(ulong)uVar4;
      if (uVar4 == 0xffff) {
        in_R8 = (iterator)0x1;
      }
      else {
        puVar7 = (pointer)(local_168._0_8_ + uVar13 * 0x20);
        pvVar15 = (iterator)0x4;
        do {
          in_R9 = pvVar15;
          if (in_R9 == (iterator)0x20) break;
          puVar2 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   *(uint *)(in_R9 + (long)&local_58._vptr_lazy_ostream);
          puVar1 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [*(uint *)(in_R9 + (long)&local_58._vptr_lazy_ostream)].super_base_blob<256U>.
                   m_data._M_elems + 0x10;
          auVar42[0] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
          auVar42[1] = -((puVar7->super_base_blob<256U>).m_data._M_elems[1] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
          auVar42[2] = -((puVar7->super_base_blob<256U>).m_data._M_elems[2] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
          auVar42[3] = -((puVar7->super_base_blob<256U>).m_data._M_elems[3] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
          auVar42[4] = -((puVar7->super_base_blob<256U>).m_data._M_elems[4] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
          auVar42[5] = -((puVar7->super_base_blob<256U>).m_data._M_elems[5] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
          auVar42[6] = -((puVar7->super_base_blob<256U>).m_data._M_elems[6] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
          auVar42[7] = -((puVar7->super_base_blob<256U>).m_data._M_elems[7] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
          auVar42[8] = -((puVar7->super_base_blob<256U>).m_data._M_elems[8] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
          auVar42[9] = -((puVar7->super_base_blob<256U>).m_data._M_elems[9] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
          auVar42[10] = -((puVar7->super_base_blob<256U>).m_data._M_elems[10] ==
                         (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
          auVar42[0xb] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xb] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar42[0xc] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xc] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar42[0xd] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xd] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar42[0xe] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xe] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar42[0xf] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xf] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar29[0] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x10] == *puVar1);
          auVar29[1] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x11] == puVar1[1]);
          auVar29[2] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x12] == puVar1[2]);
          auVar29[3] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x13] == puVar1[3]);
          auVar29[4] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x14] == puVar1[4]);
          auVar29[5] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x15] == puVar1[5]);
          auVar29[6] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x16] == puVar1[6]);
          auVar29[7] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x17] == puVar1[7]);
          auVar29[8] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x18] == puVar1[8]);
          auVar29[9] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x19] == puVar1[9]);
          auVar29[10] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1a] == puVar1[10]);
          auVar29[0xb] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1b] == puVar1[0xb]);
          auVar29[0xc] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1c] == puVar1[0xc]);
          auVar29[0xd] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1d] == puVar1[0xd]);
          auVar29[0xe] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1e] == puVar1[0xe]);
          auVar29[0xf] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1f] == puVar1[0xf]);
          auVar29 = auVar29 & auVar42;
          pvVar15 = in_R9 + 4;
        } while ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) != 0xffff);
        in_R8 = (iterator)(ulong)(in_R9 != (iterator)0x20);
      }
      pvVar14 = pvVar14 + (long)in_R8;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uVar21 + uVar12) - uVar19);
    auVar30._8_4_ = (int)((ulong)pvVar14 >> 0x20);
    auVar30._0_8_ = pvVar14;
    auVar30._12_4_ = 0x45300000;
    local_248 = (auVar30._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)pvVar14) - 4503599627370496.0);
  }
  if (uVar17 == 0) {
    local_1b8 = 0.0;
  }
  else {
    uVar22 = (ulong)local_f8.size;
    uVar13 = (ulong)((uVar11 & 0x1ffff) << 0xe);
    pvVar14 = (iterator)0x0;
    do {
      uVar20 = *(uint *)(((pointer)(local_168._0_8_ + uVar13 * 0x20))->super_base_blob<256U>).m_data
                        ._M_elems * uVar22;
      uVar8 = uVar20 >> 0x20;
      local_58._vptr_lazy_ostream =
           (_func_int **)
           CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->
                                    super_base_blob<256U>).m_data._M_elems + 4) * uVar22 >> 0x20),
                    (int)(uVar20 >> 0x20));
      local_58._8_4_ =
           (uint)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->super_base_blob<256U>).
                            m_data._M_elems + 8) * uVar22 >> 0x20);
      local_58._12_4_ =
           (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->super_base_blob<256U>).
                           m_data._M_elems + 0xc) * uVar22 >> 0x20);
      local_48 = (undefined1 *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x14) * uVar22 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x10) * uVar22 >>
                               0x20));
      local_40 = (lazy_ostream *)
                 CONCAT44((int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar22 >>
                               0x20),
                          (int)(*(uint *)((((pointer)(local_168._0_8_ + uVar13 * 0x20))->
                                          super_base_blob<256U>).m_data._M_elems + 0x18) * uVar22 >>
                               0x20));
      puVar7 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start + uVar8;
      puVar1 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8].super_base_blob<256U>.m_data._M_elems + 0x10;
      puVar2 = (pointer)(local_168._0_8_ + uVar13 * 0x20);
      auVar43[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[0]);
      auVar43[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[1]);
      auVar43[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[2]);
      auVar43[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[3]);
      auVar43[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[4]);
      auVar43[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[5]);
      auVar43[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[6]);
      auVar43[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[7]);
      auVar43[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[8]);
      auVar43[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[9]);
      auVar43[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar7->super_base_blob<256U>).m_data._M_elems[10]);
      auVar43[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar43[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar43[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar43[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar43[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar7->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar3 = (((pointer)(local_168._0_8_ + uVar13 * 0x20))->super_base_blob<256U>).m_data._M_elems
               + 0x10;
      auVar31[0] = -(*puVar3 == *puVar1);
      auVar31[1] = -(puVar3[1] == puVar1[1]);
      auVar31[2] = -(puVar3[2] == puVar1[2]);
      auVar31[3] = -(puVar3[3] == puVar1[3]);
      auVar31[4] = -(puVar3[4] == puVar1[4]);
      auVar31[5] = -(puVar3[5] == puVar1[5]);
      auVar31[6] = -(puVar3[6] == puVar1[6]);
      auVar31[7] = -(puVar3[7] == puVar1[7]);
      auVar31[8] = -(puVar3[8] == puVar1[8]);
      auVar31[9] = -(puVar3[9] == puVar1[9]);
      auVar31[10] = -(puVar3[10] == puVar1[10]);
      auVar31[0xb] = -(puVar3[0xb] == puVar1[0xb]);
      auVar31[0xc] = -(puVar3[0xc] == puVar1[0xc]);
      auVar31[0xd] = -(puVar3[0xd] == puVar1[0xd]);
      auVar31[0xe] = -(puVar3[0xe] == puVar1[0xe]);
      auVar31[0xf] = -(puVar3[0xf] == puVar1[0xf]);
      auVar31 = auVar31 & auVar43;
      uVar4 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar31[0xf] >> 7) << 0xf;
      in_R9 = (iterator)(ulong)uVar4;
      if (uVar4 == 0xffff) {
        in_R8 = (iterator)0x1;
      }
      else {
        puVar7 = (pointer)(local_168._0_8_ + uVar13 * 0x20);
        pvVar15 = (iterator)0x4;
        do {
          in_R9 = pvVar15;
          if (in_R9 == (iterator)0x20) break;
          puVar2 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   *(uint *)(in_R9 + (long)&local_58._vptr_lazy_ostream);
          puVar1 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [*(uint *)(in_R9 + (long)&local_58._vptr_lazy_ostream)].super_base_blob<256U>.
                   m_data._M_elems + 0x10;
          auVar44[0] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
          auVar44[1] = -((puVar7->super_base_blob<256U>).m_data._M_elems[1] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
          auVar44[2] = -((puVar7->super_base_blob<256U>).m_data._M_elems[2] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
          auVar44[3] = -((puVar7->super_base_blob<256U>).m_data._M_elems[3] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
          auVar44[4] = -((puVar7->super_base_blob<256U>).m_data._M_elems[4] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
          auVar44[5] = -((puVar7->super_base_blob<256U>).m_data._M_elems[5] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
          auVar44[6] = -((puVar7->super_base_blob<256U>).m_data._M_elems[6] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
          auVar44[7] = -((puVar7->super_base_blob<256U>).m_data._M_elems[7] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
          auVar44[8] = -((puVar7->super_base_blob<256U>).m_data._M_elems[8] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
          auVar44[9] = -((puVar7->super_base_blob<256U>).m_data._M_elems[9] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
          auVar44[10] = -((puVar7->super_base_blob<256U>).m_data._M_elems[10] ==
                         (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
          auVar44[0xb] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xb] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar44[0xc] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xc] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar44[0xd] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xd] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar44[0xe] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xe] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar44[0xf] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0xf] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar32[0] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x10] == *puVar1);
          auVar32[1] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x11] == puVar1[1]);
          auVar32[2] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x12] == puVar1[2]);
          auVar32[3] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x13] == puVar1[3]);
          auVar32[4] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x14] == puVar1[4]);
          auVar32[5] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x15] == puVar1[5]);
          auVar32[6] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x16] == puVar1[6]);
          auVar32[7] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x17] == puVar1[7]);
          auVar32[8] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x18] == puVar1[8]);
          auVar32[9] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x19] == puVar1[9]);
          auVar32[10] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1a] == puVar1[10]);
          auVar32[0xb] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1b] == puVar1[0xb]);
          auVar32[0xc] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1c] == puVar1[0xc]);
          auVar32[0xd] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1d] == puVar1[0xd]);
          auVar32[0xe] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1e] == puVar1[0xe]);
          auVar32[0xf] = -((puVar7->super_base_blob<256U>).m_data._M_elems[0x1f] == puVar1[0xf]);
          auVar32 = auVar32 & auVar44;
          pvVar15 = in_R9 + 4;
        } while ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) != 0xffff);
        in_R8 = (iterator)(ulong)(in_R9 != (iterator)0x20);
      }
      pvVar14 = pvVar14 + (long)in_R8;
      uVar13 = uVar13 + 1;
    } while (uVar13 < (uVar17 & 0xffff8000));
    auVar35._8_4_ = (int)((ulong)pvVar14 >> 0x20);
    auVar35._0_8_ = pvVar14;
    auVar35._12_4_ = 0x45300000;
    local_1b8 = (auVar35._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)pvVar14) - 4503599627370496.0);
  }
  dVar36 = (double)uVar17;
  local_1b8 = local_1b8 / (dVar36 * 0.5);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xb3;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  local_150 = &local_200;
  local_200 = 0x3ff0000000000000;
  local_128 = &local_1b8;
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b8 == 1.0);
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_118 = "";
  local_40 = (lazy_ostream *)&local_128;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad4c0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_150;
  local_148.m_message.px = (element_type *)(local_148.m_message._1_8_ << 8);
  local_148._0_8_ = &PTR__lazy_ostream_013ad4c0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar45 = "hit_rate_fresh";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,(lazy_ostream *)local_1f8,1,2,REQUIRE,0xe7ec11,(size_t)&local_120,0xb3,
             &local_58,"1.0",&local_148,dVar36,dVar34,dVar33);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xb6;
  file_01.m_begin = (iterator)&local_210;
  msg_01.m_end = pvVar15;
  msg_01.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_220,
             msg_01);
  dVar34 = dVar34 / (dVar36 * 0.25);
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(dVar34 + dVar34 < local_248 / (dVar36 * 0.25));
  local_148.m_message = (shared_ptr<boost::basic_wrap_stringstream<char>_>)ZEXT816(0);
  local_1f8._0_8_ = "hit_rate_stale > 2 * hit_rate_erased_but_contained";
  local_1f8._8_8_ = "";
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_228 = "";
  local_40 = (lazy_ostream *)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_58,1,0,WARN,(check_type)pcVar45,(size_t)&local_230,0xb6);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  if (local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if ((_Head_base<0UL,_std::atomic<unsigned_char>_*,_false>)
      local_f8.collection_flags.mem._M_t.
      super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
      .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::atomic<unsigned_char>_*,_false>)0x0) {
    operator_delete__((void *)local_f8.collection_flags.mem._M_t.
                              super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>.
                              _M_head_impl);
  }
  local_f8.collection_flags.mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
       (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
       )(__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
         )0x0;
  if (local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_168._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._0_8_,(long)local_158 - local_168._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void test_cache_erase(size_t megabytes)
{
    double load = 1;
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;

    /** Insert the first half */
    for (uint32_t i = 0; i < (n_insert / 2); ++i)
        set.insert(hashes_insert_copy[i]);
    /** Erase the first quarter */
    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        BOOST_CHECK(set.contains(hashes[i], true));
    /** Insert the second half */
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        set.insert(hashes_insert_copy[i]);

    /** elements that we marked as erased but are still there */
    size_t count_erased_but_contained = 0;
    /** elements that we did not erase but are older */
    size_t count_stale = 0;
    /** elements that were most recently inserted */
    size_t count_fresh = 0;

    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        count_erased_but_contained += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 4); i < (n_insert / 2); ++i)
        count_stale += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        count_fresh += set.contains(hashes[i], false);

    double hit_rate_erased_but_contained = double(count_erased_but_contained) / (double(n_insert) / 4.0);
    double hit_rate_stale = double(count_stale) / (double(n_insert) / 4.0);
    double hit_rate_fresh = double(count_fresh) / (double(n_insert) / 2.0);

    // Check that our hit_rate_fresh is perfect
    BOOST_CHECK_EQUAL(hit_rate_fresh, 1.0);
    // Check that we have a more than 2x better hit rate on stale elements than
    // erased elements.
    BOOST_CHECK(hit_rate_stale > 2 * hit_rate_erased_but_contained);
}